

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

Cord __thiscall absl::lts_20250127::Cord::Subcord(Cord *this,size_t pos,size_t new_size)

{
  RefcountAndFlags *pRVar1;
  uint8_t uVar2;
  undefined8 uVar3;
  bool bVar4;
  CordRepBtree *this_00;
  CordRep *in_RCX;
  CordRep *pCVar5;
  CordRep *extraout_RDX;
  CordRep *extraout_RDX_00;
  CordRep *extraout_RDX_01;
  CordRep *extraout_RDX_02;
  long lVar6;
  CordRepBtree *pCVar7;
  CordRep *pCVar8;
  CordRep *n;
  undefined4 uVar9;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar10;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar11;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar12;
  undefined4 extraout_XMM0_Dd;
  Cord CVar13;
  ChunkIterator local_c8;
  
  uVar9 = 0;
  uVar10 = 0;
  uVar11 = 0;
  uVar12 = 0;
  (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 0;
  (this->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
  pCVar5 = (CordRep *)(long)(char)*(byte *)pos;
  if (((ulong)pCVar5 & 1) == 0) {
    pCVar8 = (CordRep *)((ulong)pCVar5 >> 1);
  }
  else {
    pCVar8 = (CordRep *)**(undefined8 **)(pos + 8);
  }
  if (pCVar8 < new_size) {
    new_size = (size_t)pCVar8;
  }
  n = (CordRep *)((long)pCVar8 - new_size);
  if (in_RCX <= (CordRep *)((long)pCVar8 - new_size)) {
    n = in_RCX;
  }
  if (n == (CordRep *)0x0) goto LAB_002340f8;
  this_00 = *(CordRepBtree **)(pos + 8);
  if (this_00 == (CordRepBtree *)0x0 || (*(byte *)pos & 1) == 0) {
    lVar6 = 0;
    if (((ulong)pCVar5 & 1) == 0) {
      lVar6 = pos + 1;
    }
    cord_internal::InlineData::set_inline_data
              ((InlineData *)this,(char *)(((CordRep *)new_size)->storage + lVar6 + -0xd),(size_t)n)
    ;
    pCVar5 = extraout_RDX;
    goto LAB_002340f8;
  }
  if ((CordRep *)0xf < n) {
    if ((this_00->super_CordRep).tag == '\x02') {
      this_00 = (CordRepBtree *)this_00->edges_[0];
    }
    uVar2 = (this_00->super_CordRep).tag;
    if (uVar2 == '\x03') {
      this_00 = (CordRepBtree *)cord_internal::CordRepBtree::SubTree(this_00,new_size,(size_t)n);
    }
    else {
      if (this_00 == (CordRepBtree *)0x0) {
        __assert_fail("rep != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0x1a3,
                      "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                     );
      }
      pCVar5 = (CordRep *)(this_00->super_CordRep).length;
      if (pCVar5 <= new_size) {
        __assert_fail("pos < rep->length",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0x1a5,
                      "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                     );
      }
      if ((CordRep *)((long)pCVar5 - new_size) < n) {
        __assert_fail("n <= rep->length - pos",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0x1a6,
                      "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                     );
      }
      if (pCVar5 == n) {
        LOCK();
        pRVar1 = &(this_00->super_CordRep).refcount;
        (pRVar1->count_).super___atomic_base<int>._M_i =
             (pRVar1->count_).super___atomic_base<int>._M_i + 2;
        UNLOCK();
      }
      else {
        pCVar7 = this_00;
        if (uVar2 == '\x01') {
          new_size = (size_t)(this_00->edges_[0]->storage +
                             (long)(((CordRep *)new_size)->storage + -0x1a));
          pCVar7 = (CordRepBtree *)this_00->edges_[1];
        }
        this_00 = (CordRepBtree *)operator_new(0x20);
        (this_00->super_CordRep).length = 0;
        (this_00->super_CordRep).refcount = (atomic<int>)0x0;
        (this_00->super_CordRep).tag = '\0';
        (this_00->super_CordRep).storage[0] = '\0';
        (this_00->super_CordRep).storage[1] = '\0';
        (this_00->super_CordRep).storage[2] = '\0';
        this_00->edges_[0] = (CordRep *)0x0;
        this_00->edges_[1] = (CordRep *)0x0;
        (this_00->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
        (this_00->super_CordRep).length = (size_t)n;
        (this_00->super_CordRep).tag = '\x01';
        this_00->edges_[0] = (CordRep *)new_size;
        if (pCVar7 == (CordRepBtree *)0x0) {
          __assert_fail("rep != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                        ,0x391,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)");
        }
        LOCK();
        pRVar1 = &(pCVar7->super_CordRep).refcount;
        (pRVar1->count_).super___atomic_base<int>._M_i =
             (pRVar1->count_).super___atomic_base<int>._M_i + 2;
        UNLOCK();
        this_00->edges_[1] = &pCVar7->super_CordRep;
      }
    }
    (this->contents_).data_.rep_.field_0.as_tree.rep = &this_00->super_CordRep;
    (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 1;
    bVar4 = cord_internal::InlineData::is_either_profiled((InlineData *)this,(InlineData *)pos);
    pCVar5 = extraout_RDX_01;
    if (bVar4) {
      cord_internal::CordzInfo::MaybeTrackCordImpl((InlineData *)this,(InlineData *)pos,kSubCord);
      pCVar5 = extraout_RDX_02;
    }
    goto LAB_002340f8;
  }
  (this->contents_).data_.rep_.field_0.data[0] = (char)n * '\x02';
  local_c8.current_leaf_ = (Nullable<absl::cord_internal::CordRep_*>)0x0;
  local_c8.bytes_remaining_ = 0;
  local_c8.current_chunk_ = (string_view)ZEXT816(0);
  local_c8.btree_reader_.remaining_ = 0;
  local_c8.btree_reader_.navigator_.height_ = -1;
  if (this_00 == (CordRepBtree *)0x0 || ((ulong)pCVar5 & 1) == 0) {
    if (((ulong)pCVar5 & 1) == 0) {
      local_c8.bytes_remaining_ = (ulong)pCVar5 >> 1;
      pos = pos + 1;
      local_c8.current_chunk_._M_str = (char *)pos;
      local_c8.current_chunk_._M_len = local_c8.bytes_remaining_;
    }
    else {
      Subcord();
      uVar9 = extraout_XMM0_Da;
      uVar10 = extraout_XMM0_Db;
      uVar11 = extraout_XMM0_Dc;
      uVar12 = extraout_XMM0_Dd;
LAB_00234157:
      local_c8.current_chunk_._M_len._4_4_ = uVar10;
      local_c8.current_chunk_._M_len._0_4_ = uVar9;
      local_c8.current_chunk_._M_str._0_4_ = uVar11;
      local_c8.current_chunk_._M_str._4_4_ = uVar12;
    }
  }
  else {
    local_c8.bytes_remaining_ = (this_00->super_CordRep).length;
    if ((CordRep *)local_c8.bytes_remaining_ == (CordRep *)0x0) goto LAB_00234157;
    ChunkIterator::InitTree(&local_c8,&this_00->super_CordRep);
  }
  if (local_c8.bytes_remaining_ < new_size) {
    __assert_fail("bytes_remaining_ >= n",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.h"
                  ,0x63d,"void absl::Cord::ChunkIterator::AdvanceBytes(size_t)");
  }
  if (local_c8.current_chunk_._M_len < new_size || local_c8.current_chunk_._M_len - new_size == 0) {
    if ((CordRep *)new_size != (CordRep *)0x0) {
      if (((long)local_c8.btree_reader_.navigator_.height_ < 0) ||
         (local_c8.btree_reader_.navigator_.node_[local_c8.btree_reader_.navigator_.height_] ==
          (CordRepBtree *)0x0)) {
        local_c8.bytes_remaining_ = 0;
      }
      else {
        ChunkIterator::AdvanceBytesBtree(&local_c8,new_size);
      }
    }
  }
  else {
    local_c8.current_chunk_._M_str = local_c8.current_chunk_._M_str + new_size;
    local_c8.current_chunk_._M_len = local_c8.current_chunk_._M_len - new_size;
    local_c8.bytes_remaining_ = (size_t)(local_c8.bytes_remaining_ - new_size);
  }
  if ((CordRep *)local_c8.bytes_remaining_ != (CordRep *)0x0) {
    pos = (size_t)((this->contents_).data_.rep_.field_0.data + 1);
    pCVar5 = n;
    do {
      pCVar8 = (CordRep *)((long)pCVar5 - local_c8.current_chunk_._M_len);
      if (pCVar5 < local_c8.current_chunk_._M_len || pCVar8 == (CordRep *)0x0) goto LAB_00233ffa;
      if (local_c8.current_chunk_._M_len < (CordRep *)0x8) {
        if (local_c8.current_chunk_._M_len < (CordRep *)0x4) {
          if ((CordRep *)local_c8.current_chunk_._M_len != (CordRep *)0x0) {
            *(char *)pos = *local_c8.current_chunk_._M_str;
            *(char *)(pos + (local_c8.current_chunk_._M_len >> 1)) =
                 local_c8.current_chunk_._M_str[local_c8.current_chunk_._M_len >> 1];
            ((char *)(pos + -1))[local_c8.current_chunk_._M_len] =
                 (local_c8.current_chunk_._M_str + -1)[local_c8.current_chunk_._M_len];
          }
        }
        else {
          uVar9 = *(undefined4 *)
                   (local_c8.current_chunk_._M_str + -4 + local_c8.current_chunk_._M_len);
          *(undefined4 *)pos = *(undefined4 *)local_c8.current_chunk_._M_str;
          *(undefined4 *)((char *)(pos + -4) + local_c8.current_chunk_._M_len) = uVar9;
        }
      }
      else {
        if ((CordRep *)0xf < local_c8.current_chunk_._M_len) goto LAB_00234186;
        uVar3 = *(undefined8 *)
                 (local_c8.current_chunk_._M_str + -8 + local_c8.current_chunk_._M_len);
        *(undefined8 *)pos = *(undefined8 *)local_c8.current_chunk_._M_str;
        *(undefined8 *)((char *)(pos + -8) + local_c8.current_chunk_._M_len) = uVar3;
      }
      pos = pos + local_c8.current_chunk_._M_len;
      pCVar5 = (CordRep *)(local_c8.bytes_remaining_ - local_c8.current_chunk_._M_len);
      if (local_c8.bytes_remaining_ < local_c8.current_chunk_._M_len) {
        __assert_fail("bytes_remaining_ >= current_chunk_.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.h"
                      ,0x611,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
      }
      local_c8.bytes_remaining_ = (size_t)pCVar5;
      if (pCVar5 != (CordRep *)0x0) {
        if (((long)local_c8.btree_reader_.navigator_.height_ < 0) ||
           (local_c8.btree_reader_.navigator_.node_[local_c8.btree_reader_.navigator_.height_] ==
            (CordRepBtree *)0x0)) {
          if ((CordRep *)local_c8.current_chunk_._M_len == (CordRep *)0x0) {
            __assert_fail("!current_chunk_.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.h"
                          ,0x617,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
          }
          local_c8.current_chunk_ = (string_view)ZEXT816(0);
        }
        else {
          local_c8.current_chunk_ = cord_internal::CordRepBtreeReader::Next(&local_c8.btree_reader_)
          ;
        }
      }
      pCVar5 = pCVar8;
    } while ((CordRep *)local_c8.bytes_remaining_ != (CordRep *)0x0);
  }
  Subcord();
  pCVar5 = extraout_RDX_00;
LAB_00233ffa:
  if (pCVar5 < (CordRep *)0x8) {
    if (pCVar5 < (CordRep *)0x4) {
      if (pCVar5 != (CordRep *)0x0) {
        *(char *)pos = *local_c8.current_chunk_._M_str;
        *(char *)(pos + ((ulong)pCVar5 >> 1)) = local_c8.current_chunk_._M_str[(ulong)pCVar5 >> 1];
        ((char *)(pos + -1))[(long)pCVar5] = (local_c8.current_chunk_._M_str + -1)[(long)pCVar5];
      }
    }
    else {
      uVar9 = *(undefined4 *)(local_c8.current_chunk_._M_str + -4 + (long)pCVar5);
      *(undefined4 *)pos = *(undefined4 *)local_c8.current_chunk_._M_str;
      *(undefined4 *)((char *)(pos + -4) + (long)pCVar5) = uVar9;
    }
  }
  else {
    if ((CordRep *)0xf < pCVar5) {
LAB_00234186:
      __assert_fail("n <= 15",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                    ,0x62,
                    "void absl::cord_internal::SmallMemmove(char *, const char *, size_t) [nullify_tail = false]"
                   );
    }
    uVar3 = *(undefined8 *)(local_c8.current_chunk_._M_str + -8 + (long)pCVar5);
    *(undefined8 *)pos = *(undefined8 *)local_c8.current_chunk_._M_str;
    *(undefined8 *)((char *)(pos + -8) + (long)pCVar5) = uVar3;
  }
LAB_002340f8:
  CVar13.contents_.data_.rep_.field_0.as_tree.rep = pCVar5;
  CVar13.contents_.data_.rep_.field_0.as_tree.cordz_info = (cordz_info_t)this;
  return (Cord)CVar13.contents_.data_.rep_.field_0;
}

Assistant:

Cord Cord::Subcord(size_t pos, size_t new_size) const {
  Cord sub_cord;
  size_t length = size();
  if (pos > length) pos = length;
  if (new_size > length - pos) new_size = length - pos;
  if (new_size == 0) return sub_cord;

  CordRep* tree = contents_.tree();
  if (tree == nullptr) {
    sub_cord.contents_.set_data(contents_.data() + pos, new_size);
    return sub_cord;
  }

  if (new_size <= InlineRep::kMaxInline) {
    sub_cord.contents_.set_inline_size(new_size);
    char* dest = sub_cord.contents_.data_.as_chars();
    Cord::ChunkIterator it = chunk_begin();
    it.AdvanceBytes(pos);
    size_t remaining_size = new_size;
    while (remaining_size > it->size()) {
      cord_internal::SmallMemmove(dest, it->data(), it->size());
      remaining_size -= it->size();
      dest += it->size();
      ++it;
    }
    cord_internal::SmallMemmove(dest, it->data(), remaining_size);
    return sub_cord;
  }

  tree = cord_internal::SkipCrcNode(tree);
  if (tree->IsBtree()) {
    tree = tree->btree()->SubTree(pos, new_size);
  } else {
    tree = CordRepSubstring::Substring(tree, pos, new_size);
  }
  sub_cord.contents_.EmplaceTree(tree, contents_.data_,
                                 CordzUpdateTracker::kSubCord);
  return sub_cord;
}